

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  array<vec<4UL,_double>,_3UL> pts;
  vec3f eye;
  vec3f center;
  vec3f up;
  double dVar2;
  reference pvVar3;
  size_t __n;
  void *__buf;
  double in_stack_fffffffffffff850;
  allocator<char> local_769;
  string local_768;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  double dStack_6f0;
  vec4f local_6e0;
  int local_6bc;
  undefined1 auStack_6b8 [4];
  int j;
  array<vec<4UL,_double>,_3UL> screen_coords;
  size_t i;
  mat4 local_638;
  mat4 local_5b8;
  double local_538;
  double dStack_530;
  double local_528;
  double local_518;
  double dStack_510;
  double local_508;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  _func_int **local_4e0;
  double dStack_4d8;
  double local_4d0;
  double dStack_4c8;
  double local_4c0;
  double dStack_4b8;
  double local_4b0;
  double dStack_4a8;
  double local_4a0;
  double dStack_498;
  double local_490;
  double dStack_488;
  double local_480;
  double dStack_478;
  double local_470;
  double dStack_468;
  undefined1 local_460 [8];
  PhongShader shader;
  DepthBuffer zbuffer;
  TGAImage image;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  Model model;
  
  model.specularmap_._36_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"obj/african_head.obj",&local_139);
  Model::Model((Model *)local_118,&local_138,true,false,false);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  vec<3UL,_double>::normalize(&light_dir);
  TGAImage::TGAImage((TGAImage *)
                     &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,800,800,3);
  DepthBuffer::DepthBuffer((DepthBuffer *)&shader.uniform_light_dir.z,800,800);
  PhongShader::PhongShader((PhongShader *)local_460);
  local_4e8 = ::eye.z;
  local_4f8 = ::eye.x;
  dStack_4f0 = ::eye.y;
  local_508 = ::center.z;
  local_518 = ::center.x;
  dStack_510 = ::center.y;
  local_528 = ::up.z;
  local_538 = ::up.x;
  dStack_530 = ::up.y;
  eye.y = ::eye.z;
  eye.x = ::eye.y;
  eye.z = ::center.x;
  center.y = ::center.z;
  center.x = ::center.y;
  center.z = ::up.x;
  up.y = ::up.z;
  up.x = ::up.y;
  up.z = in_stack_fffffffffffff850;
  lookat(eye,center,up);
  shader.super_IShader.uniform_ModelView.rows[3].data[1] = local_470;
  shader.super_IShader.uniform_ModelView.rows[3].data[2] = dStack_468;
  shader.super_IShader.uniform_ModelView.rows[2].data[3] = local_480;
  shader.super_IShader.uniform_ModelView.rows[3].data[0] = dStack_478;
  shader.super_IShader.uniform_ModelView.rows[2].data[1] = local_490;
  shader.super_IShader.uniform_ModelView.rows[2].data[2] = dStack_488;
  shader.super_IShader.uniform_ModelView.rows[1].data[3] = local_4a0;
  shader.super_IShader.uniform_ModelView.rows[2].data[0] = dStack_498;
  shader.super_IShader.uniform_ModelView.rows[1].data[1] = local_4b0;
  shader.super_IShader.uniform_ModelView.rows[1].data[2] = dStack_4a8;
  shader.super_IShader.uniform_ModelView.rows[0].data[3] = local_4c0;
  shader.super_IShader.uniform_ModelView.rows[1].data[0] = dStack_4b8;
  shader.super_IShader.uniform_ModelView.rows[0].data[1] = local_4d0;
  shader.super_IShader.uniform_ModelView.rows[0].data[2] = dStack_4c8;
  shader.super_IShader._vptr_IShader = local_4e0;
  shader.super_IShader.uniform_ModelView.rows[0].data[0] = dStack_4d8;
  viewport(&local_5b8,100,100,600,600);
  shader.super_IShader.uniform_Viewport.rows[3].data[1] = local_5b8.rows[3].data[2];
  shader.super_IShader.uniform_Viewport.rows[3].data[2] = local_5b8.rows[3].data[3];
  shader.super_IShader.uniform_Viewport.rows[2].data[3] = local_5b8.rows[3].data[0];
  shader.super_IShader.uniform_Viewport.rows[3].data[0] = local_5b8.rows[3].data[1];
  shader.super_IShader.uniform_Viewport.rows[2].data[1] = local_5b8.rows[2].data[2];
  shader.super_IShader.uniform_Viewport.rows[2].data[2] = local_5b8.rows[2].data[3];
  shader.super_IShader.uniform_Viewport.rows[1].data[3] = local_5b8.rows[2].data[0];
  shader.super_IShader.uniform_Viewport.rows[2].data[0] = local_5b8.rows[2].data[1];
  shader.super_IShader.uniform_Viewport.rows[1].data[1] = local_5b8.rows[1].data[2];
  shader.super_IShader.uniform_Viewport.rows[1].data[2] = local_5b8.rows[1].data[3];
  shader.super_IShader.uniform_Viewport.rows[0].data[3] = local_5b8.rows[1].data[0];
  shader.super_IShader.uniform_Viewport.rows[1].data[0] = local_5b8.rows[1].data[1];
  shader.super_IShader.uniform_Viewport.rows[0].data[1] = local_5b8.rows[0].data[2];
  shader.super_IShader.uniform_Viewport.rows[0].data[2] = local_5b8.rows[0].data[3];
  shader.super_IShader.uniform_ModelView.rows[3].data[3] = local_5b8.rows[0].data[0];
  shader.super_IShader.uniform_Viewport.rows[0].data[0] = local_5b8.rows[0].data[1];
  operator-((vec<3UL,_double> *)&i,&::eye,&::center);
  dVar1 = vec<3UL,_double>::norm((vec<3UL,_double> *)&i);
  projection(&local_638,-1.0 / dVar1);
  memcpy(shader.super_IShader.uniform_Viewport.rows[3].data + 3,&local_638,0x80);
  shader.ndc_tri.rows[2].z = light_dir.x;
  shader.uniform_light_dir.x = light_dir.y;
  shader.uniform_light_dir.y = light_dir.z;
  screen_coords._M_elems[2].data[3] = 0.0;
  while( true ) {
    dVar1 = screen_coords._M_elems[2].data[3];
    dVar2 = (double)Model::nfaces((Model *)local_118);
    if ((ulong)dVar2 <= (ulong)dVar1) break;
    std::array<vec<4UL,_double>,_3UL>::array((array<vec<4UL,_double>,_3UL> *)auStack_6b8);
    for (local_6bc = 0; local_6bc < 3; local_6bc = local_6bc + 1) {
      PhongShader::vertex(&local_6e0,(PhongShader *)local_460,(Model *)local_118,
                          screen_coords._M_elems[2].data[3]._0_4_,local_6bc);
      pvVar3 = std::array<vec<4UL,_double>,_3UL>::operator[]
                         ((array<vec<4UL,_double>,_3UL> *)auStack_6b8,(long)local_6bc);
      pvVar3->data[0] = local_6e0.data[0];
      pvVar3->data[1] = local_6e0.data[1];
      pvVar3->data[2] = local_6e0.data[2];
      pvVar3->data[3] = local_6e0.data[3];
    }
    local_6f8 = screen_coords._M_elems[2].data[1];
    dStack_6f0 = screen_coords._M_elems[2].data[2];
    local_708 = screen_coords._M_elems[1].data[3];
    dStack_700 = screen_coords._M_elems[2].data[0];
    local_718 = screen_coords._M_elems[1].data[1];
    dStack_710 = screen_coords._M_elems[1].data[2];
    local_728 = screen_coords._M_elems[0].data[3];
    dStack_720 = screen_coords._M_elems[1].data[0];
    local_738 = screen_coords._M_elems[0].data[1];
    dStack_730 = screen_coords._M_elems[0].data[2];
    local_748 = _auStack_6b8;
    dStack_740 = screen_coords._M_elems[0].data[0];
    pts._M_elems[0].data[1] = screen_coords._M_elems[0].data[0];
    pts._M_elems[0].data[0] = _auStack_6b8;
    pts._M_elems[0].data[2] = screen_coords._M_elems[0].data[1];
    pts._M_elems[0].data[3] = screen_coords._M_elems[0].data[2];
    pts._M_elems[1].data[0] = screen_coords._M_elems[0].data[3];
    pts._M_elems[1].data[1] = screen_coords._M_elems[1].data[0];
    pts._M_elems[1].data[2] = screen_coords._M_elems[1].data[1];
    pts._M_elems[1].data[3] = screen_coords._M_elems[1].data[2];
    pts._M_elems[2].data[0] = screen_coords._M_elems[1].data[3];
    pts._M_elems[2].data[1] = screen_coords._M_elems[2].data[0];
    pts._M_elems[2].data[2] = screen_coords._M_elems[2].data[1];
    pts._M_elems[2].data[3] = screen_coords._M_elems[2].data[2];
    triangle((Model *)local_118,pts,(IShader *)local_460,
             (TGAImage *)
             &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(DepthBuffer *)&shader.uniform_light_dir.z);
    screen_coords._M_elems[2].data[3] = (double)((long)screen_coords._M_elems[2].data[3] + 1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"output.tga",&local_769);
  __n = 1;
  TGAImage::write_tga_file
            ((TGAImage *)
             &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_768,true,true);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  DepthBuffer::write((DepthBuffer *)&shader.uniform_light_dir.z,0x110040,__buf,__n);
  model.specularmap_._36_4_ = 0;
  PhongShader::~PhongShader((PhongShader *)local_460);
  DepthBuffer::~DepthBuffer((DepthBuffer *)&shader.uniform_light_dir.z);
  TGAImage::~TGAImage((TGAImage *)
                      &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Model::~Model((Model *)local_118);
  return model.specularmap_._36_4_;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};

    light_dir.normalize();

    TGAImage image(width, height, TGAImage::RGB);
    DepthBuffer zbuffer(width, height);

    // GouraudShader shader;
    PhongShader shader;
    shader.uniform_ModelView = lookat(eye, center, up);
    shader.uniform_Viewport = viewport(width / 8, height / 8, width * 3 / 4, height * 3 / 4);
    shader.uniform_Projection = projection(-1. / (eye - center).norm());
    shader.uniform_light_dir = light_dir;
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec4f, 3> screen_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = shader.vertex(model, i, j);
        }
        triangle(model, screen_coords, shader, image, zbuffer);
    }

    // image.flip_vertically();  // to place the origin in the bottom left corner of the image
    // zbuffer.flip_vertically();
    image.write_tga_file("output.tga");
    zbuffer.write("zbuffer.tga");

    return 0;
}